

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<Fad<double>_>::Vector(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  int iVar1;
  long *plVar2;
  EVP_PKEY_CTX *src;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Fad<double> *this_00;
  
  iVar1 = a->num_elts;
  lVar3 = (long)iVar1;
  this->ptr_to_data = (Fad<double> *)0x0;
  this->num_elts = iVar1;
  if (lVar3 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar5 = lVar3 * 0x20 + 8;
    }
    plVar2 = (long *)operator_new__(uVar5);
    *plVar2 = lVar3;
    lVar4 = 0;
    this_00 = (Fad<double> *)(plVar2 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar4 = lVar4 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar4 != lVar3 * 0x20);
    this->ptr_to_data = (Fad<double> *)(plVar2 + 1);
    copy(this,(EVP_PKEY_CTX *)a,src);
    return;
  }
  return;
}

Assistant:

inline Vector< T >::Vector(const Vector< T >& a) : num_elts(a.num_elts), ptr_to_data((T*)0)
// copy constructor
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(const Vector< T >& ) |copy constructor   |";
#endif
    
    if ( num_elts != 0 ) {
      ptr_to_data = new T[num_elts];
      copy(a);
    }

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}